

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

bool OpenMD::operator==(SelectionSet *ss1,SelectionSet *ss2)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 6) break;
    bVar2 = operator==((OpenMDBitSet *)
                       ((long)&(((ss1->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar4),
                       (OpenMDBitSet *)
                       ((long)&(((ss2->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar4));
    lVar4 = lVar4 + 0x28;
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return 5 < uVar3;
}

Assistant:

bool operator==(const SelectionSet& ss1, const SelectionSet& ss2) {
    for (int i = 0; i < N_SELECTIONTYPES; i++) {
      assert(ss1.bitsets_[i].size() == ss2.bitsets_[i].size());
      if (!(ss1.bitsets_[i] == ss2.bitsets_[i])) return false;
    }

    return true;
  }